

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::con_<64L,_3L,_3L,_1,_1,_1,_1>::con_(con_<64L,_3L,_3L,_1,_1,_1,_1> *this,num_con_outputs o)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  string sStack_1b8;
  ostringstream dlib_o_out;
  uint auStack_180 [88];
  
  resizable_tensor::resizable_tensor(&this->params);
  auVar3 = ZEXT816(0) << 0x40;
  (this->filters).inst.super_tensor.m_size = 0;
  auVar4 = ZEXT1632(auVar3);
  (this->filters).inst.super_tensor.m_n = auVar4._0_8_;
  (this->filters).inst.super_tensor.m_k = auVar4._8_8_;
  (this->filters).inst.super_tensor.m_nr = auVar4._16_8_;
  (this->filters).inst.super_tensor.m_nc = auVar4._24_8_;
  (this->filters).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa488;
  (this->filters).inst.data_instance = (gpu_data *)0x0;
  (this->filters).inst._annotation = (any *)0x0;
  (this->filters).inst.data_offset = 0;
  (this->biases).inst.super_tensor.m_size = 0;
  (this->biases).inst.super_tensor.m_n = auVar4._0_8_;
  (this->biases).inst.super_tensor.m_k = auVar4._8_8_;
  (this->biases).inst.super_tensor.m_nr = auVar4._16_8_;
  (this->biases).inst.super_tensor.m_nc = auVar4._24_8_;
  (this->biases).inst.super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa488;
  *(undefined1 (*) [32])&(this->biases).inst.data_instance = ZEXT1632(auVar3);
  (this->conv).impl = (tensor_conv)ZEXT1632(auVar3);
  this->learning_rate_multiplier = 1.0;
  this->weight_decay_multiplier = 1.0;
  this->bias_learning_rate_multiplier = 1.0;
  this->bias_weight_decay_multiplier = 0.0;
  this->num_filters_ = o.num_outputs;
  this->padding_y_ = 1;
  this->padding_x_ = 1;
  this->use_bias = true;
  this->use_relu = false;
  if (0 < (long)o.num_outputs) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x43);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/layers.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "dlib::con_<64, 3, 3, 1, 1>::con_(num_con_outputs) [_num_filters = 64, _nr = 3, _nc = 3, _stride_y = 1, _stride_x = 1, _padding_y = 1, _padding_x = 1]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"num_filters_ > 0");
  std::operator<<(poVar2,".\n");
  puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar2,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

con_(
            num_con_outputs o
        ) : 
            learning_rate_multiplier(1),
            weight_decay_multiplier(1),
            bias_learning_rate_multiplier(1),
            bias_weight_decay_multiplier(0),
            num_filters_(o.num_outputs),
            padding_y_(_padding_y),
            padding_x_(_padding_x),
            use_bias(true),
            use_relu(false)
        {
            DLIB_CASSERT(num_filters_ > 0);
        }